

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

CService *
LookupNumeric(CService *__return_storage_ptr__,string *name,uint16_t portDefault,
             DNSLookupFn dns_lookup_function)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  DNSLookupFn dns_lookup_function_00;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_RCX;
  size_type sVar4;
  direct_or_indirect *pdVar5;
  long in_FS_OFFSET;
  bool bVar6;
  _Any_data in_stack_ffffffffffffff58;
  _Manager_type in_stack_ffffffffffffff68;
  _Invoker_type in_stack_ffffffffffffff70;
  direct_or_indirect local_88;
  uint local_78;
  direct_or_indirect local_60;
  uint local_50;
  char local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = name->_M_string_length == 0;
  if ((!bVar6) && (pcVar2 = (name->_M_dataplus)._M_p, *pcVar2 != '\0')) {
    sVar4 = 1;
    do {
      bVar6 = name->_M_string_length == sVar4;
      if (bVar6) break;
      pcVar1 = pcVar2 + sVar4;
      sVar4 = sVar4 + 1;
    } while (*pcVar1 != '\0');
  }
  if (bVar6) {
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&stack0xffffffffffffff58,in_RCX);
    dns_lookup_function_00.super__Function_base._M_manager = in_stack_ffffffffffffff68;
    dns_lookup_function_00.super__Function_base._M_functor = in_stack_ffffffffffffff58;
    dns_lookup_function_00._M_invoker = in_stack_ffffffffffffff70;
    Lookup((optional<CService> *)&local_60.indirect_contents,name,portDefault,false,
           dns_lookup_function_00);
    CService::CService((CService *)&local_88.indirect_contents);
    pdVar5 = &local_88;
    if (local_38 != '\0') {
      pdVar5 = &local_60;
    }
    uVar3 = *(undefined8 *)&(pdVar5->indirect_contents).capacity;
    (__return_storage_ptr__->super_CNetAddr).m_addr._union.indirect_contents.indirect =
         *(char **)&(((_Optional_base<CService,_false,_false> *)
                     &(pdVar5->indirect_contents).indirect)->_M_payload).
                    super__Optional_payload<CService,_true,_false,_false>.
                    super__Optional_payload_base<CService>._M_payload;
    *(undefined8 *)((long)&(__return_storage_ptr__->super_CNetAddr).m_addr._union + 8) = uVar3;
    (__return_storage_ptr__->super_CNetAddr).m_addr._size =
         *(size_type *)((long)&(&pdVar5->indirect_contents)[1].indirect + 4);
    *(undefined4 *)((long)&(&pdVar5->indirect_contents)[1].indirect + 4) = 0;
    *(char **)&(__return_storage_ptr__->super_CNetAddr).m_net =
         (&pdVar5->indirect_contents)[2].indirect;
    __return_storage_ptr__->port = *(uint16_t *)(pdVar5->direct + 0x20);
    if (0x10 < local_78) {
      free(local_88.indirect_contents.indirect);
      local_88.indirect_contents.indirect = (char *)0x0;
    }
    if ((local_38 == '\x01') && (local_38 = '\0', 0x10 < local_50)) {
      free(local_60.indirect_contents.indirect);
      local_60.indirect_contents.indirect = (char *)0x0;
    }
    if (in_stack_ffffffffffffff68 != (_Manager_type)0x0) {
      (*in_stack_ffffffffffffff68)
                ((_Any_data *)&stack0xffffffffffffff58,(_Any_data *)&stack0xffffffffffffff58,
                 __destroy_functor);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    CService::CService(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CService LookupNumeric(const std::string& name, uint16_t portDefault, DNSLookupFn dns_lookup_function)
{
    if (!ContainsNoNUL(name)) {
        return {};
    }
    // "1.2:345" will fail to resolve the ip, but will still set the port.
    // If the ip fails to resolve, re-init the result.
    return Lookup(name, portDefault, /*fAllowLookup=*/false, dns_lookup_function).value_or(CService{});
}